

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_set_strict_cipher_list(SSL *ssl,char *str)

{
  bool bVar1;
  pointer pSVar2;
  uint local_28;
  bool has_aes_hw;
  char *str_local;
  SSL *ssl_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    if ((*(ushort *)&pSVar2->field_0x10d >> 0xb & 1) == 0) {
      local_28 = EVP_has_aes_hardware();
    }
    else {
      pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      local_28 = (uint)((byte)((ushort)*(undefined2 *)&pSVar2->field_0x10d >> 0xc) & 1);
    }
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    bVar1 = bssl::ssl_create_cipher_list(&pSVar2->cipher_list,local_28 != 0,str,true);
    ssl_local._4_4_ = (uint)bVar1;
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set_strict_cipher_list(SSL *ssl, const char *str) {
  if (!ssl->config) {
    return 0;
  }
  const bool has_aes_hw = ssl->config->aes_hw_override
                              ? ssl->config->aes_hw_override_value
                              : EVP_has_aes_hardware();
  return ssl_create_cipher_list(&ssl->config->cipher_list, has_aes_hw, str,
                                true /* strict */);
}